

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# networkDataTypes.cpp
# Opt level: O2

bool __thiscall TrodesConfig::isValid(TrodesConfig *this)

{
  bool bVar1;
  const_reference this_00;
  long lVar2;
  const_reference pvVar3;
  int i;
  size_type sVar4;
  
  sVar4 = 0;
  do {
    if ((long)(int)(((long)(this->devices).super__Vector_base<NDevice,_std::allocator<NDevice>_>.
                           _M_impl.super__Vector_impl_data._M_finish -
                    (long)(this->devices).super__Vector_base<NDevice,_std::allocator<NDevice>_>.
                          _M_impl.super__Vector_impl_data._M_start) / 0x48) <= (long)sVar4) {
      sVar4 = 0;
      while( true ) {
        lVar2 = (long)(int)(((long)(this->nTrodes).
                                   super__Vector_base<NTrodeObj,_std::allocator<NTrodeObj>_>._M_impl
                                   .super__Vector_impl_data._M_finish -
                            (long)(this->nTrodes).
                                  super__Vector_base<NTrodeObj,_std::allocator<NTrodeObj>_>._M_impl.
                                  super__Vector_impl_data._M_start) / 0x48);
        bVar1 = lVar2 <= (long)sVar4;
        if (lVar2 <= (long)sVar4) {
          return bVar1;
        }
        pvVar3 = std::vector<NTrodeObj,_std::allocator<NTrodeObj>_>::at(&this->nTrodes,sVar4);
        if ((pvVar3->id)._M_string_length == 0) break;
        sVar4 = sVar4 + 1;
        if ((pvVar3->hw_chans).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start ==
            (pvVar3->hw_chans).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          return bVar1;
        }
      }
      return bVar1;
    }
    this_00 = std::vector<NDevice,_std::allocator<NDevice>_>::at(&this->devices,sVar4);
    bVar1 = NDevice::isValid(this_00);
    sVar4 = sVar4 + 1;
  } while (bVar1);
  return false;
}

Assistant:

bool TrodesConfig::isValid() const {
//    std::cerr << "ISVALID check on TrodesConfig() " << this << "\n";
    // if (devices.empty()){ //there must always at least be an MCU
    //     std::cerr << "NO DEVICES\n";
    //     return(false);
    // }

    for (int i = 0; i < (int)devices.size(); i++) {
        if (!devices.at(i).isValid()){ //check that all devices are valid
            return(false);
        }
    }

    for (int i = 0; i < (int)nTrodes.size(); i++) {
        if (!nTrodes.at(i).isValid()){ //check that all added nTrodes are valid
            return(false);
        }
    }
    return(true);
}